

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,int *v,int v_min,int v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ImGuiDataType data_type_00;
  int iVar7;
  undefined8 unaff_RBX;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  float fVar13;
  ImVec2 IVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  pIVar3 = GImGui;
  uVar8 = (ulong)(flags & 1);
  uVar9 = data_type & 0xfffffffe;
  bVar10 = uVar9 == 8;
  bVar11 = power != 1.0;
  iVar6 = (int)CONCAT71((int7)((ulong)v >> 8),NAN(power));
  uVar4 = v_min - v_max;
  uVar12 = -uVar4;
  if (0 < (int)uVar4) {
    uVar12 = uVar4;
  }
  fVar17 = (&(bb->Min).x)[uVar8];
  fVar1 = (&(bb->Max).x)[uVar8];
  fVar18 = (fVar1 - fVar17) + -4.0;
  fVar16 = (GImGui->Style).GrabMinSize;
  if (uVar9 != 8) {
    fVar15 = fVar18 / (float)(int)(uVar12 + 1);
    uVar4 = -(uint)(fVar16 <= fVar15);
    fVar16 = (float)(~uVar4 & (uint)fVar16 | (uint)fVar15 & uVar4);
  }
  if (fVar18 <= fVar16) {
    fVar16 = fVar18;
  }
  if (v_max * v_min < 0 && (bVar11 && bVar10)) {
    fVar15 = (float)v_min;
    if (v_min < 0) {
      fVar15 = -fVar15;
    }
    fVar15 = powf(fVar15,1.0 / power);
    fVar13 = (float)v_max;
    if (v_max < 0) {
      fVar13 = -fVar13;
    }
    fVar13 = powf(fVar13,1.0 / power);
    fVar15 = fVar15 / (fVar13 + fVar15);
  }
  else if (v_min < 0) {
    fVar15 = 1.0;
  }
  else {
    fVar15 = 0.0;
  }
  fVar17 = fVar17 + 2.0 + fVar16 * 0.5;
  if (pIVar3->ActiveId != id) {
    bVar11 = false;
    goto LAB_0015e510;
  }
  if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
    IVar14 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    fVar13 = IVar14.x;
    if (uVar8 != 0) {
      fVar13 = -IVar14.y;
    }
    if ((pIVar3->NavActivatePressedId == id) && (pIVar3->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if ((fVar13 != 0.0) || (NAN(fVar13))) {
      iVar6 = v_max;
      fVar19 = SliderCalcRatioFromValueT<int,float>(data_type,*v,v_min,v_max,power,fVar15);
      if (uVar9 == 8) {
        iVar7 = ImParseFormatPrecision(format,3);
        iVar6 = (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),~(bVar11 && bVar10));
        if ((~(bVar11 && bVar10) & iVar7 < 1) != 0) goto LAB_0015e2a0;
        fVar13 = fVar13 / 100.0;
        if (0.0 < (GImGui->IO).NavInputs[0xe]) {
          fVar13 = fVar13 / 10.0;
        }
      }
      else {
LAB_0015e2a0:
        if ((uVar12 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          iVar6 = 0x19a988;
          fVar13 = *(float *)(&DAT_0019a988 + (ulong)(fVar13 < 0.0) * 4) / (float)(int)uVar12;
        }
        else {
          fVar13 = fVar13 / 100.0;
        }
      }
      uVar12 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
      fVar13 = (float)(~uVar12 & (uint)fVar13 | (uint)(fVar13 * 10.0) & uVar12);
      if ((fVar19 < 1.0) || (fVar13 <= 0.0)) {
        if ((0.0 < fVar19) || (0.0 <= fVar13)) {
          fVar19 = fVar19 + fVar13;
          fVar13 = 1.0;
          if (fVar19 <= 1.0) {
            fVar13 = fVar19;
          }
          fVar19 = (float)(~-(uint)(fVar19 < 0.0) & (uint)fVar13);
          goto LAB_0015e163;
        }
        bVar2 = false;
      }
      else {
        bVar2 = false;
      }
      goto LAB_0015e3a5;
    }
    fVar19 = 0.0;
    bVar2 = false;
  }
  else {
    fVar19 = 0.0;
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar3->IO).MouseDown[0] != false) {
        if (0.0 < fVar18 - fVar16) {
          fVar13 = (*(float *)((pIVar3->IO).MouseDown + uVar8 * 4 + -8) - fVar17) /
                   (fVar18 - fVar16);
          fVar19 = 1.0;
          if (fVar13 <= 1.0) {
            fVar19 = fVar13;
          }
          fVar19 = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar19);
        }
        if (uVar8 != 0) {
          fVar19 = 1.0 - fVar19;
        }
LAB_0015e163:
        bVar2 = true;
        goto LAB_0015e3a5;
      }
      ClearActiveID();
    }
    fVar19 = 0.0;
    bVar2 = false;
  }
LAB_0015e3a5:
  if (bVar2) {
    if (bVar11 && bVar10) {
      if (fVar15 <= fVar19) {
        uVar12 = -(uint)(1e-06 < ABS(fVar15 + -1.0));
        fVar13 = powf((float)(~uVar12 & (uint)fVar19 |
                             (uint)((fVar19 - fVar15) / (1.0 - fVar15)) & uVar12),power);
        uVar12 = 0;
        iVar6 = v_max;
        if (0 < v_min) {
          uVar12 = v_min;
        }
      }
      else {
        fVar13 = powf(1.0 - fVar19 / fVar15,power);
        uVar12 = v_max >> 0x1f & v_max;
        iVar6 = v_min;
      }
      iVar6 = iVar6 - uVar12;
      data_type_00 = (ImGuiDataType)((float)iVar6 * fVar13 + (float)(int)uVar12);
    }
    else if (uVar9 == 8) {
      data_type_00 = (ImGuiDataType)((float)(v_max - v_min) * fVar19 + (float)v_min);
    }
    else {
      fVar19 = fVar19 * (float)(v_max - v_min);
      iVar5 = (int)fVar19;
      iVar7 = (int)(fVar19 + 0.5);
      if (iVar7 < iVar5) {
        iVar7 = iVar5;
      }
      data_type_00 = iVar7 + v_min;
    }
    iVar6 = RoundScalarWithFormatT<int,int>
                      ((ImGui *)format,(char *)(ulong)(uint)data_type,data_type_00,iVar6);
    bVar11 = *v != iVar6;
    if (bVar11) {
      *v = iVar6;
      bVar11 = true;
    }
  }
  else {
    bVar11 = false;
  }
LAB_0015e510:
  if (1.0 <= fVar18) {
    fVar18 = SliderCalcRatioFromValueT<int,float>(data_type,*v,v_min,v_max,power,fVar15);
    if (uVar8 != 0) {
      fVar18 = 1.0 - fVar18;
    }
    fVar17 = (((fVar1 + -2.0) - fVar16 * 0.5) - fVar17) * fVar18 + fVar17;
    if (uVar8 == 0) {
      fVar1 = (bb->Min).y;
      fVar18 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar16 * 0.5 + fVar17;
      (out_grab_bb->Min).y = fVar1 + 2.0;
      (out_grab_bb->Max).x = fVar16 * 0.5 + fVar17;
      (out_grab_bb->Max).y = fVar18 + -2.0;
    }
    else {
      fVar1 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar16 * 0.5 + fVar17;
      (out_grab_bb->Max).x = fVar1 + -2.0;
      (out_grab_bb->Max).y = fVar16 * 0.5 + fVar17;
    }
  }
  else {
    IVar14 = bb->Min;
    out_grab_bb->Min = IVar14;
    out_grab_bb->Max = IVar14;
  }
  return bVar11;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}